

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O3

void Qentem::Digit::formatStringNumberFixed<false,Qentem::StringStream<char>>
               (StringStream<char> *stream,SizeT started_at,SizeT32 precision,
               SizeT32 calculated_digits,SizeT32 fraction_length,bool round_up)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  SizeT new_capacity;
  char cVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  SizeT SVar11;
  char cVar12;
  uint uVar13;
  uint uVar14;
  bool power_increased;
  SizeT index;
  bool local_45;
  uint local_44;
  uint local_40;
  SizeT32 local_3c;
  ulong local_38;
  
  SVar11 = stream->length_;
  pcVar1 = stream->storage_;
  uVar9 = (ulong)started_at;
  local_45 = false;
  uVar13 = SVar11 - started_at;
  uVar14 = fraction_length - uVar13;
  if (fraction_length < uVar13) {
    uVar14 = 0;
  }
  local_44 = started_at;
  if (fraction_length != 0) {
    if (precision < uVar14) {
      local_44 = SVar11 - 1;
      pcVar1[local_44] = '0';
    }
    else {
      uVar7 = fraction_length + started_at;
      pcVar10 = pcVar1;
      if (precision < fraction_length) {
        local_44 = ~precision + uVar7;
        local_40 = uVar7;
        local_3c = calculated_digits;
        local_38 = uVar9;
        roundStringNumber<Qentem::StringStream<char>>
                  (stream,&local_44,&local_45,uVar13 < fraction_length || round_up);
        uVar2 = (ulong)local_44;
        SVar11 = stream->length_;
        pcVar10 = stream->storage_;
        uVar9 = local_38;
        uVar7 = local_40;
        calculated_digits = local_3c;
        started_at = local_44;
        if (SVar11 != 0) {
          for (pcVar8 = pcVar1 + uVar2;
              (started_at = local_44, pcVar8 < pcVar10 + (SVar11 - 1) &&
              (started_at = (SizeT)uVar2, *pcVar8 == '0')); pcVar8 = pcVar8 + 1) {
            local_44 = started_at + 1;
            uVar2 = (ulong)local_44;
          }
        }
      }
      iVar5 = uVar13 - fraction_length;
      if (uVar13 < fraction_length || iVar5 == 0) {
        if ((started_at < SVar11) || (local_45 == true)) {
          if (uVar13 < fraction_length) {
            if (local_45 != false) {
              local_44 = started_at - (started_at == SVar11);
              pcVar1[local_44] = '1';
            }
            uVar14 = uVar14 - local_45;
            if (uVar14 < 0x14) {
              SVar11 = stream->length_;
            }
            else {
              uVar13 = stream->length_;
              do {
                SVar11 = uVar13 + 0x13;
                if (stream->capacity_ < SVar11) {
                  StringStream<char>::expand(stream,SVar11);
                  uVar13 = stream->length_;
                }
                Memory::Copy<unsigned_int>(stream->storage_ + uVar13,"0000000000000000000",0x13);
                uVar14 = uVar14 - 0x13;
                stream->length_ = SVar11;
                uVar13 = SVar11;
              } while (0x13 < uVar14);
            }
            uVar13 = uVar14 + SVar11;
            if (stream->capacity_ < uVar13) {
              StringStream<char>::expand(stream,uVar13);
              SVar11 = stream->length_;
            }
            Memory::Copy<unsigned_int>(stream->storage_ + SVar11,"0000000000000000000",uVar14);
            stream->length_ = uVar13;
            new_capacity = uVar13 + 1;
            uVar14 = uVar13;
            if (stream->capacity_ == uVar13) {
              StringStream<char>::expand(stream,new_capacity);
              uVar14 = stream->length_;
            }
            SVar11 = uVar13 + 2;
            stream->storage_[uVar14] = '.';
            stream->length_ = new_capacity;
            if (stream->capacity_ == new_capacity) {
              StringStream<char>::expand(stream,SVar11);
              new_capacity = stream->length_;
            }
            pcVar1 = stream->storage_;
          }
          else {
            if (local_45 != 0) goto LAB_00127264;
            new_capacity = SVar11 + 1;
            uVar13 = SVar11;
            if (stream->capacity_ == SVar11) {
              StringStream<char>::expand(stream,new_capacity);
              uVar13 = stream->length_;
              pcVar10 = stream->storage_;
            }
            pcVar10[uVar13] = '.';
            stream->length_ = new_capacity;
            SVar11 = SVar11 + 2;
            if (stream->capacity_ == new_capacity) {
              StringStream<char>::expand(stream,SVar11);
              new_capacity = stream->length_;
            }
            pcVar1 = stream->storage_;
          }
          pcVar1[new_capacity] = '0';
          stream->length_ = SVar11;
        }
        else {
          local_44 = started_at - 1;
          pcVar1[local_44] = '0';
        }
      }
      else if (started_at < uVar7) {
        if (uVar7 < SVar11) {
          pcVar1 = pcVar10 + (ulong)uVar7 + 1;
          cVar12 = pcVar1[-1];
          pcVar1[-1] = '.';
          if (pcVar1 < pcVar10 + SVar11) {
            uVar2 = (ulong)uVar7 + 1;
            cVar6 = cVar12;
            do {
              cVar12 = pcVar10[uVar2];
              pcVar10[uVar2] = cVar6;
              uVar2 = uVar2 + 1;
              cVar6 = cVar12;
            } while (SVar11 != uVar2);
          }
          uVar13 = stream->length_;
          SVar11 = uVar13 + 1;
          if (stream->capacity_ == uVar13) {
            StringStream<char>::expand(stream,SVar11);
            uVar13 = stream->length_;
          }
          stream->storage_[uVar13] = cVar12;
          stream->length_ = SVar11;
        }
      }
      else {
        if ((local_45 != true) &&
           (uVar14 = started_at - (int)uVar9, iVar5 = uVar14 - (uVar13 - calculated_digits),
           uVar14 < uVar13 - calculated_digits)) {
          iVar5 = 0;
        }
        for (; iVar5 != 0; iVar5 = iVar5 + -1) {
          started_at = started_at - 1;
          pcVar1[started_at] = '0';
          local_44 = started_at;
        }
      }
    }
  }
LAB_00127264:
  uVar13 = stream->length_;
  uVar2 = (ulong)uVar13;
  if ((uint)uVar9 < uVar13) {
    uVar4 = uVar9 & 0xffffffff;
    do {
      uVar3 = uVar4 + 1;
      pcVar1 = stream->storage_;
      cVar12 = pcVar1[uVar4];
      pcVar1[uVar4] = pcVar1[uVar2 - 1];
      stream->storage_[uVar2 - 1] = cVar12;
      uVar2 = uVar2 - 1;
      uVar4 = uVar3;
    } while (uVar3 < uVar2);
    uVar13 = stream->length_;
  }
  local_44 = local_44 - (uint)uVar9;
  if (local_44 <= uVar13) {
    stream->length_ = uVar13 - local_44;
  }
  return;
}

Assistant:

static void formatStringNumberFixed(Stream_T &stream, const SizeT started_at, const SizeT32 precision,
                                        const SizeT32 calculated_digits, const SizeT32 fraction_length,
                                        const bool round_up) {
        using Char_T              = typename Stream_T::CharType;
        Char_T     *storage       = stream.Storage();
        const SizeT number_length = (stream.Length() - started_at);
        SizeT       index         = started_at;
        const SizeT dot_index     = SizeT(started_at + fraction_length);
        SizeT32     diff          = ((fraction_length > number_length) ? SizeT32(fraction_length - number_length) : 0);
        bool        power_increased = false;
        const bool  fraction_only   = (number_length <= fraction_length);
        /////////////////////////////////////////////////////
        if (fraction_length != 0) {
            if (diff <= precision) {
                if (fraction_length > precision) {
                    index += SizeT(fraction_length - (precision + SizeT{1}));
                    roundStringNumber(stream, index, power_increased, (round_up | (diff != 0)));

                    Char_T       *number = (storage + index);
                    const Char_T *last   = stream.Last();

                    while ((number < last) && (*number == DigitUtils::DigitChar::Zero)) {
                        ++number;
                        ++index;
                    }
                }

                if (fraction_only) {
                    if ((index < stream.Length()) || power_increased) {
                        if (diff != 0) {
                            if (power_increased) {
                                index -= SizeT(index == stream.Length());
                                storage[index] = DigitUtils::DigitChar::One;
                            }

                            diff -= SizeT32(power_increased);
                            insertZerosLarge(stream, diff);
                            stream += DigitUtils::DigitChar::Dot;
                            stream += DigitUtils::DigitChar::Zero;
                        } else if (!power_increased) {
                            stream += DigitUtils::DigitChar::Dot;
                            stream += DigitUtils::DigitChar::Zero;
                        }
                    } else {
                        --index;
                        storage[index] = DigitUtils::DigitChar::Zero;
                    }
                } else if (index < dot_index) {
                    stream.InsertAt(DigitUtils::DigitChar::Dot, dot_index);
                } else {
                    SizeT zeros = 0;

                    if (power_increased) {
                        zeros = SizeT(number_length - fraction_length);
                    } else {
                        const SizeT rem    = (index - started_at);
                        const SizeT needed = SizeT(number_length - calculated_digits);

                        if (rem > needed) {
                            zeros = (rem - needed);
                        }
                    }

                    while (zeros != 0) {
                        --index;
                        storage[index] = DigitUtils::DigitChar::Zero;
                        --zeros;
                    }
                }
            } else {
                index += (number_length - SizeT{1});
                storage[index] = DigitUtils::DigitChar::Zero;
            }
        }

        stream.Reverse(started_at);
        stream.StepBack(index - started_at);

        if QENTEM_CONST_EXPRESSION (Fixed_T) {
            if ((dot_index == index) || ((stream.Length() - started_at) == SizeT{1}) ||
                (!fraction_only && power_increased)) {
                stream += DigitUtils::DigitChar::Dot;
                insertZerosLarge(stream, precision);
            } else if (fraction_only) {
                insertZerosLarge(
                    stream, SizeT32(precision -
                                    SizeT32(stream.Length() - (started_at + SizeT{2})))); // 2 is the length of '0.'.
            } else {
                insertZerosLarge(stream, SizeT32(precision - (dot_index - index)));
            }
        }
    }